

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O2

void __thiscall QUndoGroup::setActiveStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  QUndoStack *pQVar2;
  bool bVar3;
  char *pcVar4;
  int __c;
  int _t1;
  long in_FS_OFFSET;
  Connection aCStack_78 [8];
  Connection local_70 [8];
  Connection local_68 [8];
  Connection local_60 [8];
  Connection local_58 [8];
  Connection local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  pQVar2 = *(QUndoStack **)(lVar1 + 0x78);
  if (pQVar2 != stack) {
    if (pQVar2 != (QUndoStack *)0x0) {
      QObject::disconnect((QObject *)pQVar2,"2canUndoChanged(bool)",(QObject *)this,
                          "2canUndoChanged(bool)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2undoTextChanged(QString)",(QObject *)this,
                          "2undoTextChanged(QString)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2canRedoChanged(bool)",(QObject *)this,
                          "2canRedoChanged(bool)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2redoTextChanged(QString)",(QObject *)this,
                          "2redoTextChanged(QString)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2indexChanged(int)",(QObject *)this,
                          "2indexChanged(int)");
      QObject::disconnect(*(QObject **)(lVar1 + 0x78),"2cleanChanged(bool)",(QObject *)this,
                          "2cleanChanged(bool)");
    }
    *(QUndoStack **)(lVar1 + 0x78) = stack;
    if (stack == (QUndoStack *)0x0) {
      _t1 = 0;
      canUndoChanged(this,false);
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      undoTextChanged(this,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      canRedoChanged(this,false);
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      redoTextChanged(this,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      cleanChanged(this,true);
    }
    else {
      QObject::connect((QObject *)local_50,(char *)stack,(QObject *)"2canUndoChanged(bool)",
                       (char *)this,0x61558d);
      QMetaObject::Connection::~Connection(local_50);
      QObject::connect((QObject *)local_58,*(char **)(lVar1 + 0x78),
                       (QObject *)"2undoTextChanged(QString)",(char *)this,0x6155a3);
      QMetaObject::Connection::~Connection(local_58);
      QObject::connect((QObject *)local_60,*(char **)(lVar1 + 0x78),
                       (QObject *)"2canRedoChanged(bool)",(char *)this,0x6155bd);
      QMetaObject::Connection::~Connection(local_60);
      QObject::connect((QObject *)local_68,*(char **)(lVar1 + 0x78),
                       (QObject *)"2redoTextChanged(QString)",(char *)this,0x6155d3);
      QMetaObject::Connection::~Connection(local_68);
      QObject::connect((QObject *)local_70,*(char **)(lVar1 + 0x78),(QObject *)"2indexChanged(int)",
                       (char *)this,0x6155ed);
      QMetaObject::Connection::~Connection(local_70);
      QObject::connect((QObject *)aCStack_78,*(char **)(lVar1 + 0x78),
                       (QObject *)"2cleanChanged(bool)",(char *)this,0x615600);
      QMetaObject::Connection::~Connection(aCStack_78);
      bVar3 = QUndoStack::canUndo(*(QUndoStack **)(lVar1 + 0x78));
      canUndoChanged(this,bVar3);
      QUndoStack::undoText((QString *)&local_48,*(QUndoStack **)(lVar1 + 0x78));
      undoTextChanged(this,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      bVar3 = QUndoStack::canRedo(*(QUndoStack **)(lVar1 + 0x78));
      canRedoChanged(this,bVar3);
      QUndoStack::redoText((QString *)&local_48,*(QUndoStack **)(lVar1 + 0x78));
      redoTextChanged(this,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      bVar3 = QUndoStack::isClean(*(QUndoStack **)(lVar1 + 0x78));
      pcVar4 = (char *)(ulong)bVar3;
      cleanChanged(this,bVar3);
      pcVar4 = QUndoStack::index(*(QUndoStack **)(lVar1 + 0x78),pcVar4,__c);
      _t1 = (int)pcVar4;
    }
    indexChanged(this,_t1);
    activeStackChanged(this,*(QUndoStack **)(lVar1 + 0x78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::setActiveStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);
    if (d->active == stack)
        return;

    if (d->active != nullptr) {
        disconnect(d->active, SIGNAL(canUndoChanged(bool)),
                    this, SIGNAL(canUndoChanged(bool)));
        disconnect(d->active, SIGNAL(undoTextChanged(QString)),
                    this, SIGNAL(undoTextChanged(QString)));
        disconnect(d->active, SIGNAL(canRedoChanged(bool)),
                    this, SIGNAL(canRedoChanged(bool)));
        disconnect(d->active, SIGNAL(redoTextChanged(QString)),
                    this, SIGNAL(redoTextChanged(QString)));
        disconnect(d->active, SIGNAL(indexChanged(int)),
                    this, SIGNAL(indexChanged(int)));
        disconnect(d->active, SIGNAL(cleanChanged(bool)),
                    this, SIGNAL(cleanChanged(bool)));
    }

    d->active = stack;

    if (d->active == nullptr) {
        emit canUndoChanged(false);
        emit undoTextChanged(QString());
        emit canRedoChanged(false);
        emit redoTextChanged(QString());
        emit cleanChanged(true);
        emit indexChanged(0);
    } else {
        connect(d->active, SIGNAL(canUndoChanged(bool)),
                this, SIGNAL(canUndoChanged(bool)));
        connect(d->active, SIGNAL(undoTextChanged(QString)),
                this, SIGNAL(undoTextChanged(QString)));
        connect(d->active, SIGNAL(canRedoChanged(bool)),
                this, SIGNAL(canRedoChanged(bool)));
        connect(d->active, SIGNAL(redoTextChanged(QString)),
                this, SIGNAL(redoTextChanged(QString)));
        connect(d->active, SIGNAL(indexChanged(int)),
                this, SIGNAL(indexChanged(int)));
        connect(d->active, SIGNAL(cleanChanged(bool)),
                this, SIGNAL(cleanChanged(bool)));
        emit canUndoChanged(d->active->canUndo());
        emit undoTextChanged(d->active->undoText());
        emit canRedoChanged(d->active->canRedo());
        emit redoTextChanged(d->active->redoText());
        emit cleanChanged(d->active->isClean());
        emit indexChanged(d->active->index());
    }

    emit activeStackChanged(d->active);
}